

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O3

void internal_start_create_script_window(Am_Value_List *commands_for_script,Am_Object *cmd)

{
  Am_Slot_Key key;
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  Am_Object script_window;
  Am_Object script_execute_command;
  Am_String name;
  Am_Object sel_widget;
  Am_Object undo_db;
  Am_Object window;
  Am_Value_List local_50;
  Am_String local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_String local_28;
  Am_Object local_20;
  
  bVar1 = Am_Value_List::Empty(commands_for_script);
  if (!bVar1) {
    Am_Object::Get_Object((Am_Object *)&local_50,(Am_Slot_Key)cmd,0x170);
    pAVar2 = Am_Object::Get((Am_Object *)&local_50,0x68,0);
    Am_Object::Am_Object(&local_30,pAVar2);
    Am_Object::~Am_Object((Am_Object *)&local_50);
    get_script_window((Am_Object *)&local_50);
    pAVar2 = Am_Object::Get(&local_30,0x197,0);
    Am_Object::Am_Object(&local_38,pAVar2);
    pAVar2 = Am_Object::Get(&local_38,0x68,0);
    Am_Object::Am_Object(&local_20,pAVar2);
    gen_script_name();
    Am_Object::Get_Object((Am_Object *)&local_50.item,(Am_Slot_Key)&local_50,(ulong)Am_NAME_OBJECT);
    Am_Object::Set((Am_Object *)&local_50.item,0x169,&local_40,0);
    Am_Object::~Am_Object((Am_Object *)&local_50.item);
    Am_String::Am_String(&local_28,&local_40);
    create_script_execute_command
              ((Am_Object *)&local_50.item,&local_50,(Am_Object *)commands_for_script,&local_20,
               (Am_String *)&local_38);
    Am_String::~Am_String(&local_28);
    key = Am_SCRIPT_EXECUTE_COMMAND;
    value = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&local_50.item);
    Am_Object::Set((Am_Object *)&local_50,key,value,0);
    Am_Object::Set((Am_Object *)&local_50,Am_SHOW_SCRIPT_COMMAND,0,0);
    am_set_commands_into_script_window((Am_Object *)&local_50,(Am_Object *)&local_50.item);
    Am_Object::Set((Am_Object *)&local_50,0x69,true,0);
    Am_Object::~Am_Object((Am_Object *)&local_50.item);
    Am_String::~Am_String(&local_40);
    Am_Object::~Am_Object(&local_20);
    Am_Object::~Am_Object(&local_38);
    Am_Object::~Am_Object((Am_Object *)&local_50);
    Am_Object::~Am_Object(&local_30);
  }
  return;
}

Assistant:

void
internal_start_create_script_window(Am_Value_List &commands_for_script,
                                    Am_Object &cmd)
{
  if (!commands_for_script.Empty()) {
    Am_Object undo_db = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get(Am_WINDOW);
    Am_Object script_window = get_script_window(undo_db);

    Am_Object sel_widget = undo_db.Get(Am_SELECTION_WIDGET);
    Am_Object window = sel_widget.Get(Am_WINDOW);
    Am_String name = gen_script_name();
    script_window.Get_Object(Am_NAME_OBJECT).Set(Am_VALUE, name);
    Am_Object script_execute_command = create_script_execute_command(
        script_window, commands_for_script, window, sel_widget, name);
    script_window.Set(Am_SCRIPT_EXECUTE_COMMAND, script_execute_command);
    script_window.Set(Am_SHOW_SCRIPT_COMMAND, (0L));

    am_set_commands_into_script_window(script_window, script_execute_command);
    script_window.Set(Am_VISIBLE, true);
  }
}